

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O2

size_t ZSTD_ldm_blockCompress
                 (rawSeqStore_t *rawSeqStore,ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,
                 ZSTD_compressionParameters *cParams,void *src,size_t srcSize,int extDict)

{
  rawSeq *prVar1;
  BYTE *pBVar2;
  uint minMatch;
  uint uVar3;
  BYTE *pBVar4;
  uint uVar5;
  ZSTD_blockCompressor p_Var6;
  size_t sVar7;
  long lVar8;
  BYTE *pBVar9;
  seqDef *psVar10;
  BYTE *pBVar11;
  ulong uVar12;
  ulong uVar14;
  ulong uVar15;
  BYTE *pBVar16;
  BYTE *pBVar17;
  uint uVar18;
  ulong uVar19;
  int local_50;
  U32 UVar13;
  
  minMatch = cParams->searchLength;
  p_Var6 = ZSTD_selectBlockCompressor(cParams->strategy,extDict);
  pBVar4 = (ms->window).base;
  pBVar16 = (BYTE *)(srcSize + (long)src);
  while( true ) {
    uVar14 = rawSeqStore->pos;
    uVar19 = (long)pBVar16 - (long)src;
    local_50 = (int)pBVar4;
    if ((rawSeqStore->size <= uVar14) || (pBVar16 <= src)) break;
    prVar1 = rawSeqStore->seq + uVar14;
    uVar15._0_4_ = prVar1->offset;
    uVar15._4_4_ = prVar1->litLength;
    uVar12 = uVar15 >> 0x20;
    uVar3 = rawSeqStore->seq[uVar14].matchLength;
    uVar18 = (uint)uVar19;
    if (uVar18 < uVar3 + uVar15._4_4_) {
      uVar14 = uVar15;
      if (uVar18 - uVar15._4_4_ < minMatch) {
        uVar14 = 0;
      }
      uVar5 = uVar18 - uVar15._4_4_;
      if (uVar18 < (uint)uVar15._4_4_ || uVar18 - uVar15._4_4_ == 0) {
        uVar14 = 0;
        uVar5 = uVar3;
      }
      uVar3 = uVar5;
      ZSTD_ldm_skipSequences(rawSeqStore,uVar19 & 0xffffffff,minMatch);
      uVar15 = uVar14;
    }
    else {
      rawSeqStore->pos = uVar14 + 1;
    }
    UVar13 = (U32)uVar15;
    if (UVar13 == 0) break;
    ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
    ZSTD_ldm_fillFastTables(ms,cParams,src);
    sVar7 = (*p_Var6)(ms,seqStore,rep,cParams,src,uVar12);
    pBVar17 = (BYTE *)((long)src + uVar12);
    ms->nextToUpdate = (int)pBVar17 - local_50;
    for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -4) {
      *(undefined4 *)((long)rep + lVar8) = *(undefined4 *)((long)rep + lVar8 + -4);
    }
    *rep = UVar13;
    pBVar9 = pBVar17 + -sVar7;
    pBVar11 = seqStore->lit;
    pBVar2 = pBVar11 + sVar7;
    do {
      *(undefined8 *)pBVar11 = *(undefined8 *)pBVar9;
      pBVar11 = pBVar11 + 8;
      pBVar9 = pBVar9 + 8;
    } while (pBVar11 < pBVar2);
    seqStore->lit = seqStore->lit + sVar7;
    if (sVar7 < 0x10000) {
      psVar10 = seqStore->sequences;
    }
    else {
      seqStore->longLengthID = 1;
      psVar10 = seqStore->sequences;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar10->litLength = (U16)sVar7;
    psVar10->offset = UVar13 + 3;
    if (0xffff < uVar3 - 3) {
      seqStore->longLengthID = 2;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar10 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar10->matchLength = (U16)(uVar3 - 3);
    seqStore->sequences = psVar10 + 1;
    src = pBVar17 + uVar3;
  }
  ZSTD_ldm_limitTableUpdate(ms,(BYTE *)src);
  ZSTD_ldm_fillFastTables(ms,cParams,src);
  sVar7 = (*p_Var6)(ms,seqStore,rep,cParams,src,uVar19);
  ms->nextToUpdate = (int)pBVar16 - local_50;
  return sVar7;
}

Assistant:

size_t ZSTD_ldm_blockCompress(rawSeqStore_t* rawSeqStore,
    ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
    ZSTD_compressionParameters const* cParams, void const* src, size_t srcSize,
    int const extDict)
{
    unsigned const minMatch = cParams->searchLength;
    ZSTD_blockCompressor const blockCompressor =
        ZSTD_selectBlockCompressor(cParams->strategy, extDict);
    BYTE const* const base = ms->window.base;
    /* Input bounds */
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    /* Input positions */
    BYTE const* ip = istart;

    assert(rawSeqStore->pos <= rawSeqStore->size);
    assert(rawSeqStore->size <= rawSeqStore->capacity);
    /* Loop through each sequence and apply the block compressor to the lits */
    while (rawSeqStore->pos < rawSeqStore->size && ip < iend) {
        /* maybeSplitSequence updates rawSeqStore->pos */
        rawSeq const sequence = maybeSplitSequence(rawSeqStore,
                                                   (U32)(iend - ip), minMatch);
        int i;
        /* End signal */
        if (sequence.offset == 0)
            break;

        assert(sequence.offset <= (1U << cParams->windowLog));
        assert(ip + sequence.litLength + sequence.matchLength <= iend);

        /* Fill tables for block compressor */
        ZSTD_ldm_limitTableUpdate(ms, ip);
        ZSTD_ldm_fillFastTables(ms, cParams, ip);
        /* Run the block compressor */
        {
            size_t const newLitLength =
                blockCompressor(ms, seqStore, rep, cParams, ip,
                                sequence.litLength);
            ip += sequence.litLength;
            ms->nextToUpdate = (U32)(ip - base);
            /* Update the repcodes */
            for (i = ZSTD_REP_NUM - 1; i > 0; i--)
                rep[i] = rep[i-1];
            rep[0] = sequence.offset;
            /* Store the sequence */
            ZSTD_storeSeq(seqStore, newLitLength, ip - newLitLength,
                          sequence.offset + ZSTD_REP_MOVE,
                          sequence.matchLength - MINMATCH);
            ip += sequence.matchLength;
        }
    }
    /* Fill the tables for the block compressor */
    ZSTD_ldm_limitTableUpdate(ms, ip);
    ZSTD_ldm_fillFastTables(ms, cParams, ip);
    /* Compress the last literals */
    {
        size_t const lastLiterals = blockCompressor(ms, seqStore, rep, cParams,
                                                    ip, iend - ip);
        ms->nextToUpdate = (U32)(iend - base);
        return lastLiterals;
    }
}